

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,int,int>
          (InternalException *this,string *msg,unsigned_long params,int params_1,int params_2)

{
  undefined4 in_ECX;
  string *in_RDX;
  InternalException *in_RDI;
  undefined4 in_R8D;
  string local_40 [24];
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  Exception::ConstructMessage<unsigned_long,int,int>
            (in_RDX,CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  duckdb::InternalException::InternalException(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}